

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O2

void __thiscall iDynTree::ExternalMesh::~ExternalMesh(ExternalMesh *this)

{
  (this->super_SolidShape)._vptr_SolidShape = (_func_int **)&PTR__ExternalMesh_001e66b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->packageDirs);
  std::__cxx11::string::~string((string *)&this->filename);
  Box::~Box((Box *)this);
  return;
}

Assistant:

ExternalMesh::~ExternalMesh()
    {
    }